

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Window * sqlite3WindowDup(sqlite3 *db,Expr *pOwner,Window *p)

{
  int iVar1;
  Window *pWVar2;
  char *pcVar3;
  Expr *pEVar4;
  ExprList *pEVar5;
  
  if ((p != (Window *)0x0) &&
     (pWVar2 = (Window *)sqlite3DbMallocZero(db,0x90), pWVar2 != (Window *)0x0)) {
    pcVar3 = sqlite3DbStrDup(db,p->zName);
    pWVar2->zName = pcVar3;
    pcVar3 = sqlite3DbStrDup(db,p->zBase);
    pWVar2->zBase = pcVar3;
    if (p->pFilter == (Expr *)0x0) {
      pEVar4 = (Expr *)0x0;
    }
    else {
      pEVar4 = exprDup(db,p->pFilter,0,(EdupBuf *)0x0);
    }
    pWVar2->pFilter = pEVar4;
    pWVar2->pWFunc = p->pWFunc;
    pEVar4 = (Expr *)0x0;
    pEVar5 = sqlite3ExprListDup(db,p->pPartition,0);
    pWVar2->pPartition = pEVar5;
    pEVar5 = sqlite3ExprListDup(db,p->pOrderBy,0);
    pWVar2->pOrderBy = pEVar5;
    pWVar2->eFrmType = p->eFrmType;
    pWVar2->eEnd = p->eEnd;
    pWVar2->eStart = p->eStart;
    pWVar2->eExclude = p->eExclude;
    pWVar2->regResult = p->regResult;
    pWVar2->iArgCol = p->iArgCol;
    iVar1 = p->regAccum;
    pWVar2->iEphCsr = p->iEphCsr;
    pWVar2->regAccum = iVar1;
    pWVar2->bExprArgs = p->bExprArgs;
    if (p->pStart != (Expr *)0x0) {
      pEVar4 = exprDup(db,p->pStart,0,(EdupBuf *)0x0);
    }
    pWVar2->pStart = pEVar4;
    if (p->pEnd == (Expr *)0x0) {
      pEVar4 = (Expr *)0x0;
    }
    else {
      pEVar4 = exprDup(db,p->pEnd,0,(EdupBuf *)0x0);
    }
    pWVar2->pEnd = pEVar4;
    pWVar2->pOwner = pOwner;
    pWVar2->bImplicitFrame = p->bImplicitFrame;
    return pWVar2;
  }
  return (Window *)0x0;
}

Assistant:

SQLITE_PRIVATE Window *sqlite3WindowDup(sqlite3 *db, Expr *pOwner, Window *p){
  Window *pNew = 0;
  if( ALWAYS(p) ){
    pNew = sqlite3DbMallocZero(db, sizeof(Window));
    if( pNew ){
      pNew->zName = sqlite3DbStrDup(db, p->zName);
      pNew->zBase = sqlite3DbStrDup(db, p->zBase);
      pNew->pFilter = sqlite3ExprDup(db, p->pFilter, 0);
      pNew->pWFunc = p->pWFunc;
      pNew->pPartition = sqlite3ExprListDup(db, p->pPartition, 0);
      pNew->pOrderBy = sqlite3ExprListDup(db, p->pOrderBy, 0);
      pNew->eFrmType = p->eFrmType;
      pNew->eEnd = p->eEnd;
      pNew->eStart = p->eStart;
      pNew->eExclude = p->eExclude;
      pNew->regResult = p->regResult;
      pNew->regAccum = p->regAccum;
      pNew->iArgCol = p->iArgCol;
      pNew->iEphCsr = p->iEphCsr;
      pNew->bExprArgs = p->bExprArgs;
      pNew->pStart = sqlite3ExprDup(db, p->pStart, 0);
      pNew->pEnd = sqlite3ExprDup(db, p->pEnd, 0);
      pNew->pOwner = pOwner;
      pNew->bImplicitFrame = p->bImplicitFrame;
    }
  }
  return pNew;
}